

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O0

int evmap_signal_check_integrity_fn(event_base *base,int signum,evmap_signal *sig_info,void *arg)

{
  event *peVar1;
  anon_union_32_2_36317463_for_ev_ *local_48;
  event **nextp;
  event *elm2;
  event *elm1;
  event *ev;
  void *arg_local;
  evmap_signal *sig_info_local;
  int signum_local;
  event_base *base_local;
  
  if ((sig_info->events).lh_first != (event *)0x0) {
    elm2 = (sig_info->events).lh_first;
    nextp = (event **)(elm2->ev_).ev_io.ev_io_next.le_next;
    while (elm2 != (event *)0x0 && nextp != (event **)0x0) {
      if (elm2 == (event *)nextp) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
                   ,0x3de,"elm1 != elm2","evmap_signal_check_integrity_fn");
      }
      elm2 = (elm2->ev_).ev_io.ev_io_next.le_next;
      peVar1 = nextp[9];
      if (peVar1 == (event *)0x0) break;
      if (elm2 == peVar1) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
                   ,0x3de,"elm1 != elm2","evmap_signal_check_integrity_fn");
      }
      nextp = (event **)(peVar1->ev_).ev_io.ev_io_next.le_next;
    }
    elm2 = (sig_info->events).lh_first;
    local_48 = (anon_union_32_2_36317463_for_ev_ *)sig_info;
    while (elm2 != (event *)0x0) {
      if ((local_48->ev_io).ev_io_next.le_next != elm2) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
                   ,0x3de,"*nextp == elm1","evmap_signal_check_integrity_fn");
      }
      if (local_48 != (anon_union_32_2_36317463_for_ev_ *)(elm2->ev_).ev_io.ev_io_next.le_prev) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
                   ,0x3de,"nextp == elm1->ev_.ev_signal.ev_signal_next.le_prev",
                   "evmap_signal_check_integrity_fn");
      }
      local_48 = &elm2->ev_;
      elm2 = (local_48->ev_io).ev_io_next.le_next;
    }
  }
  elm1 = (sig_info->events).lh_first;
  while( true ) {
    if (elm1 == (event *)0x0) {
      return 0;
    }
    if (((elm1->ev_evcallback).evcb_flags & 2U) == 0) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
                 ,0x3e1,"ev->ev_flags & EVLIST_INSERTED","evmap_signal_check_integrity_fn");
    }
    if (elm1->ev_fd != signum) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
                 ,0x3e2,"ev->ev_fd == signum","evmap_signal_check_integrity_fn");
    }
    if ((elm1->ev_events & 8U) == 0) break;
    if ((elm1->ev_events & 0x86U) != 0) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
                 ,0x3e4,"!(ev->ev_events & (EV_READ|EV_WRITE|EV_CLOSED))",
                 "evmap_signal_check_integrity_fn");
    }
    elm1 = (elm1->ev_).ev_io.ev_io_next.le_next;
  }
  event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
             ,0x3e3,"(ev->ev_events & EV_SIGNAL)","evmap_signal_check_integrity_fn");
}

Assistant:

static int
evmap_signal_check_integrity_fn(struct event_base *base,
    int signum, struct evmap_signal *sig_info, void *arg)
{
	struct event *ev;
	/* First, make sure the list itself isn't corrupt. */
	EVUTIL_ASSERT_LIST_OK(&sig_info->events, event, ev_signal_next);

	LIST_FOREACH(ev, &sig_info->events, ev_io_next) {
		EVUTIL_ASSERT(ev->ev_flags & EVLIST_INSERTED);
		EVUTIL_ASSERT(ev->ev_fd == signum);
		EVUTIL_ASSERT((ev->ev_events & EV_SIGNAL));
		EVUTIL_ASSERT(!(ev->ev_events & (EV_READ|EV_WRITE|EV_CLOSED)));
	}
	return 0;
}